

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

bool __thiscall
ON_ModelComponent::SetDeletedModelComponentState
          (ON_ModelComponent *this,bool bDeleted,ON_ComponentManifest *manifest)

{
  ushort uVar1;
  ON_UUID item_id;
  ON_UUID parent_id;
  bool bVar2;
  bool bVar3;
  ON_ComponentManifestItem *pOVar4;
  ON__UINT64 OVar5;
  wchar_t *pwVar6;
  char *pcVar7;
  int iVar8;
  ON_wString *src;
  ON_wString assigned_name;
  ON_ComponentStatus component_status;
  ON_wString candidate_name;
  
  component_status = this->m_component_status;
  bVar2 = ON_ComponentStatus::IsDeleted(&component_status);
  if (bVar2 == bDeleted) {
    pcVar7 = "model_component deleted status = bDeleted";
    iVar8 = 0x8f0;
LAB_0053c0ba:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,iVar8,"",pcVar7);
  }
  else {
    ON_ComponentStatus::SetDeletedState(&component_status,bDeleted);
    bVar2 = SetModelComponentStatus(this,component_status);
    if (!bVar2) {
      pcVar7 = "cannot change component deleted state.";
      iVar8 = 0x8f7;
      goto LAB_0053c0ba;
    }
  }
  if (manifest == (ON_ComponentManifest *)0x0) {
    pOVar4 = &ON_ComponentManifestItem::UnsetItem;
  }
  else if ((bDeleted) || (bVar2 = ::operator==(&ON_nil_uuid,&this->m_component_id), bVar2)) {
    pOVar4 = ON_ComponentManifest::ItemFromComponentRuntimeSerialNumber
                       (manifest,this->m_runtime_serial_number);
  }
  else {
    pOVar4 = ON_ComponentManifest::ItemFromId(manifest,this->m_component_id);
  }
  if (manifest == (ON_ComponentManifest *)0x0) {
    bVar2 = false;
    bVar3 = true;
  }
  else {
    _candidate_name = ON_ComponentManifestItem::Id(pOVar4);
    bVar3 = ::operator==((ON_UUID_struct *)&candidate_name,&this->m_component_id);
    bVar2 = bVar3;
    if (bVar3 && bDeleted) {
      OVar5 = ON_ComponentManifestItem::ComponentRuntimeSerialNumber(pOVar4);
      bVar3 = OVar5 == this->m_runtime_serial_number;
      bVar2 = bVar3;
    }
  }
  if (bVar3 == false) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x907,"","component is not in manifest.");
  }
  if (!bDeleted) {
    ON_wString::ON_wString(&candidate_name);
    if ((this->m_set_status & 0x20) == 0) {
      if ((char)this->m_set_status < '\0') {
        ON_wString::ON_wString(&assigned_name,&this->m_component_name);
        ON_wString::operator=(&candidate_name,&assigned_name);
        ON_wString::~ON_wString(&assigned_name);
        if (((this->m_locked_status & 0x20) == 0) && ((char)this->m_set_status < '\0')) {
          this->m_set_status = this->m_set_status & 0xff5f | 0x20;
          this->m_content_version_number = this->m_content_version_number + 1;
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                     ,0x938,"","cannot model_component deleted name cannot be restored.");
        }
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x930,"","model_component name is already set");
      if ((this->m_set_status & 0x20) == 0) {
        src = &ON_wString::EmptyString;
      }
      else {
        src = &this->m_component_name;
      }
      ON_wString::ON_wString(&assigned_name,src);
      ON_wString::operator=(&candidate_name,&assigned_name);
      ON_wString::~ON_wString(&assigned_name);
    }
    if (bVar2 != false) {
      bVar2 = ON_ComponentManifestItem::IsDeleted(pOVar4);
      if (bVar2) {
        ON_wString::ON_wString(&assigned_name);
        OVar5 = this->m_runtime_serial_number;
        item_id = this->m_component_id;
        parent_id = this->m_component_parent_id;
        pwVar6 = ON_wString::operator_cast_to_wchar_t_(&candidate_name);
        pOVar4 = ON_ComponentManifest::UndeleteComponentAndChangeRuntimeSerialNumber
                           (manifest,item_id,parent_id,OVar5,pwVar6,&assigned_name);
        bVar2 = ON_ComponentManifestItem::IsDeleted(pOVar4);
        if (bVar2) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                     ,0x951,"","unable to change manifest item deleted status to false.");
        }
        pwVar6 = ON_wString::operator_cast_to_wchar_t_(&assigned_name);
        SetName(this,pwVar6);
        ON_wString::~ON_wString(&assigned_name);
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                   ,0x941,"","doc_manifest item deleted status is already false.");
      }
    }
    ON_wString::~ON_wString(&candidate_name);
    goto LAB_0053c40c;
  }
  uVar1 = this->m_set_status;
  if ((char)uVar1 < '\0') {
    pcVar7 = "component name is already deleted";
    iVar8 = 0x90f;
LAB_0053c24a:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,iVar8,"",pcVar7);
  }
  else if ((uVar1 & 0x20) != 0) {
    if ((this->m_locked_status & 0x20) != 0) {
      pcVar7 = "component name cannot be deleted.";
      iVar8 = 0x915;
      goto LAB_0053c24a;
    }
    this->m_set_status = uVar1 & 0xff5f | 0x80;
    this->m_content_version_number = this->m_content_version_number + 1;
  }
  if (bVar2 != false) {
    bVar2 = ON_ComponentManifestItem::IsDeleted(pOVar4);
    if (bVar2) {
      pcVar7 = "manifest item deleted status is already true.";
      iVar8 = 0x91e;
    }
    else {
      pOVar4 = ON_ComponentManifest::DeleteComponent(manifest,this->m_runtime_serial_number);
      bVar2 = ON_ComponentManifestItem::IsDeleted(pOVar4);
      if (bVar2) goto LAB_0053c40c;
      pcVar7 = "unable to change manifest item deleted status to true.";
      iVar8 = 0x925;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,iVar8,"",pcVar7);
  }
LAB_0053c40c:
  bVar2 = ON_ComponentStatus::IsDeleted(&this->m_component_status);
  return bVar2 == bDeleted;
}

Assistant:

bool ON_ModelComponent::SetDeletedModelComponentState(
  bool bDeleted,
  ON_ComponentManifest* manifest
  )
{
  bDeleted = bDeleted ? true : false; // ensure exact "true"
  ON_ComponentStatus component_status = ModelComponentStatus();
  if (bDeleted == component_status.IsDeleted())
  {
    // nothing to change
    ON_ERROR("model_component deleted status = bDeleted");
  }
  else
  {
    component_status.SetDeletedState(bDeleted);
    if (false == SetModelComponentStatus(component_status))
    {
      ON_ERROR("cannot change component deleted state.");
    }
  }

  const ON_ComponentManifestItem& manifest_item
    = (nullptr != manifest)
    ? ((bDeleted || ON_nil_uuid == m_component_id) ? manifest->ItemFromComponentRuntimeSerialNumber(m_runtime_serial_number) : manifest->ItemFromId(m_component_id))
    : ON_ComponentManifestItem::UnsetItem;
  
  const bool bComponentInManifest 
    = nullptr != manifest 
    && manifest_item.Id() == m_component_id
    && (false == bDeleted || manifest_item.ComponentRuntimeSerialNumber() == this->m_runtime_serial_number);
    
  if (nullptr != manifest && false == bComponentInManifest )
  {
    ON_ERROR("component is not in manifest.");
  }

  if (bDeleted)
  {
    // delete component name
    if (DeletedNameIsSet())
    {
      ON_ERROR("component name is already deleted");
    }
    else if (NameIsSet())
    {
      if (false == DeleteName())
      {
        ON_ERROR("component name cannot be deleted.");
      }
    }

    if (bComponentInManifest)
    {
      // delete manifest item
      if (manifest_item.IsDeleted())
      {
        ON_ERROR("manifest item deleted status is already true.");
      }
      else
      {
        const ON_ComponentManifestItem& deleted_manifest_item = manifest->DeleteComponent(m_runtime_serial_number);
        if (false == deleted_manifest_item.IsDeleted())
        {
          ON_ERROR("unable to change manifest item deleted status to true.");
        }
      }
    }
  }
  else
  {
    // undelete component name
    ON_wString candidate_name;
    if (NameIsSet())
    {
      ON_ERROR("model_component name is already set");
      candidate_name = Name();
    }
    else if (DeletedNameIsSet())
    {
      candidate_name = DeletedName();
      if (false == UndeleteName())
      {
        ON_ERROR("cannot model_component deleted name cannot be restored.");
      }
    }

    if (bComponentInManifest)
    {
      // undelete manifest item
      if (false == manifest_item.IsDeleted())
      {
        ON_ERROR("doc_manifest item deleted status is already false.");
      }
      else
      {
        // When an component is being replaced, it is common for the old an new component
        // to have the same id but different RuntimeSerialNumber() values.
        ON_wString assigned_name;
        const ON_ComponentManifestItem& undeleted_manifest_item = manifest->UndeleteComponentAndChangeRuntimeSerialNumber(
          Id(),
          ParentId(),
          RuntimeSerialNumber(),
          candidate_name,
          assigned_name
          );
        if (false != undeleted_manifest_item.IsDeleted())
        {
          ON_ERROR("unable to change manifest item deleted status to false.");
        }
        SetName(assigned_name);
      }
    }
  }

  return (bDeleted == IsDeleted());
}